

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeSamplerCase::verifyResult(DecodeSamplerCase *this)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  reference cl;
  MessageBuilder *pMVar2;
  bool local_499;
  allocator<char> local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  MessageBuilder local_460;
  undefined4 local_2e0;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  MessageBuilder local_2b8;
  Vector<bool,_4> local_134;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<bool,_4> local_110;
  Vector<float,_4> local_10c;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_c8 [48];
  Context *local_98;
  size_type sStack_90;
  undefined1 auStack_88 [8];
  Vec4 pixelExpected;
  Vec4 pixelReference;
  Context *pCStack_58;
  Vec4 pixelConverted;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  int resultColorIdx;
  TestLog *log;
  DecodeSamplerCase *this_local;
  
  this_00 = Context::getTestContext((this->super_SRGBTestCase).super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&pCStack_58);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(pixelExpected.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_88);
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  cl = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                 ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40
                  ,0);
  tcu::linearToSRGB((tcu *)&local_98,cl);
  pCStack_58 = local_98;
  pixelConverted.m_data[0] = (float)(undefined4)sStack_90;
  pixelConverted.m_data[1] = (float)sStack_90._4_4_;
  getColorReferenceSRGB();
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)(local_c8 + 0x20),(Vec4 *)this);
  pixelExpected.m_data[2] = (float)local_c8._32_4_;
  pixelExpected.m_data[3] = (float)local_c8._36_4_;
  getColorReferenceLinear();
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)local_c8,(Vec4 *)this);
  auStack_88 = (undefined1  [8])local_c8._0_8_;
  pixelExpected.m_data[0] = (float)local_c8._8_4_;
  pixelExpected.m_data[1] = (float)local_c8._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Expected color: ",&local_f9);
  tcu::Vector<float,_4>::Vector(&local_10c,(Vector<float,_4> *)auStack_88);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,&local_f8,0,&local_10c);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  tcu::operator-((tcu *)&local_130,(Vector<float,_4> *)&pCStack_58,
                 (Vector<float,_4> *)(pixelExpected.m_data + 2));
  tcu::abs<float,4>((tcu *)&local_120,&local_130);
  tcu::lessThan<float,4>((tcu *)&local_110,&local_120,&(this->super_SRGBTestCase).m_epsilonError);
  bVar1 = tcu::boolAll<4>(&local_110);
  local_499 = true;
  if (!bVar1) {
    tcu::equal<float,4>((tcu *)&local_134,(Vector<float,_4> *)&pCStack_58,
                        (Vector<float,_4> *)(pixelExpected.m_data + 2));
    local_499 = tcu::boolAll<4>(&local_134);
  }
  if (local_499 != false) {
    tcu::TestLog::operator<<(&local_2b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"linear as expected",&local_2d9);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_2b8,&local_2d8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    tcu::MessageBuilder::~MessageBuilder(&local_2b8);
  }
  else {
    tcu::TestLog::operator<<(&local_460,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"not linear as expected",&local_481);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_460,&local_480);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    tcu::MessageBuilder::~MessageBuilder(&local_460);
  }
  local_2e0 = 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  return local_499 != false;
}

Assistant:

bool DecodeSamplerCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelConverted;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelConverted = tcu::linearToSRGB(pixelResultList[resultColorIdx]);
	pixelReference = this->formatReferenceColor(getColorReferenceSRGB());
	pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	//	texture was rendered using a sampler object with setting DECODE_EXT, therefore, results should be linear
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelConverted - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelConverted, pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}